

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

void __thiscall
vkt::sr::anon_unknown_0::TextureQueryLodInstance::setupDefaultInputs(TextureQueryLodInstance *this)

{
  int row;
  long lVar1;
  float *pfVar2;
  ulong uVar3;
  int row_1;
  int iVar4;
  long lVar5;
  int row_2;
  float *pfVar6;
  undefined8 *puVar7;
  uint uVar8;
  long lVar9;
  float v;
  float fVar10;
  undefined4 uVar11;
  Vec4 s;
  vector<float,_std::allocator<float>_> texCoord;
  Vec4 coords [4];
  float positions [16];
  float afStack_360 [136];
  undefined8 uStack_140;
  ulong local_138;
  undefined8 uStack_130;
  vector<float,_std::allocator<float>_> local_128;
  float local_108 [4];
  ulong local_f8;
  long lStack_f0;
  float local_e8 [2];
  long lStack_e0;
  float local_d8 [2];
  long lStack_d0;
  float local_c8 [8];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68 [16];
  
  puVar7 = &local_a8;
  local_78 = 0x3f8000003f800000;
  uStack_70 = 0x3f80000000000000;
  local_88 = 0xbf8000003f800000;
  uStack_80 = 0x3f80000000000000;
  local_98 = 0x3f800000bf800000;
  uStack_90 = 0x3f80000000000000;
  local_a8 = 0xbf800000bf800000;
  uStack_a0 = 0x3f80000000000000;
  lVar9 = 0;
  uStack_140 = 0x6306d1;
  ShaderRenderCaseInstance::addAttribute
            ((ShaderRenderCaseInstance *)this,0,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,4,puVar7);
  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  lVar1 = 0;
  do {
    lVar5 = 0;
    do {
      uVar11 = 0x3f800000;
      if (lVar9 != lVar5) {
        uVar11 = 0;
      }
      *(undefined4 *)((long)puVar7 + lVar5) = uVar11;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x40);
    lVar1 = lVar1 + 1;
    puVar7 = (undefined8 *)((long)puVar7 + 4);
    lVar9 = lVar9 + 0x10;
  } while (lVar1 != 4);
  local_138 = 0;
  uStack_130 = 0;
  lVar1 = 0x8a;
  do {
    afStack_360[lVar1] =
         *(float *)((long)&(((ShaderRenderCaseInstance *)
                            (&(this->super_TextureQueryInstance).super_ShaderRenderCaseInstance.
                              m_clearColor + -3))->super_TestInstance)._vptr_TestInstance +
                   lVar1 * 4) -
         *(float *)((long)(&(this->super_TextureQueryInstance).super_ShaderRenderCaseInstance.
                            m_clearColor + -4) + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x8e);
  pfVar2 = local_108;
  local_108[0] = (float)local_138;
  local_108[1] = 0.0;
  local_108[2] = 0.0;
  local_108[3] = (this->m_minCoord).m_data[0];
  lVar1 = 0;
  local_f8 = local_138 & 0xffffffff00000000;
  lStack_f0 = (ulong)(uint)(this->m_minCoord).m_data[1] << 0x20;
  local_e8[1] = (float)uStack_130 * -0.5;
  local_e8[0] = (float)uStack_130 * 0.5;
  lStack_e0 = (ulong)(uint)((this->m_minCoord).m_data[2] + (float)uStack_130 * 0.5) << 0x20;
  local_d8[1] = uStack_130._4_4_ * 0.5;
  local_d8[0] = uStack_130._4_4_ * -0.5;
  lStack_d0 = (ulong)(uint)(uStack_130._4_4_ * 0.5 + (this->m_minCoord).m_data[3]) << 0x20;
  pfVar6 = local_68;
  local_68[0xc] = 0.0;
  local_68[0xd] = 0.0;
  local_68[0xe] = 0.0;
  local_68[0xf] = 0.0;
  local_68[8] = 0.0;
  local_68[9] = 0.0;
  local_68[10] = 0.0;
  local_68[0xb] = 0.0;
  local_68[4] = 0.0;
  local_68[5] = 0.0;
  local_68[6] = 0.0;
  local_68[7] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  do {
    lVar9 = 0;
    do {
      pfVar6[lVar9] = *(float *)((long)pfVar2 + lVar9);
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0x10);
    lVar1 = lVar1 + 1;
    pfVar6 = pfVar6 + 1;
    pfVar2 = pfVar2 + 4;
  } while (lVar1 != 4);
  puVar7 = &local_a8;
  pfVar2 = local_68;
  lVar1 = 0;
  do {
    lVar9 = 0;
    do {
      *(undefined4 *)((long)puVar7 + lVar9) = *(undefined4 *)((long)pfVar2 + lVar9);
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x40);
    lVar1 = lVar1 + 1;
    puVar7 = (undefined8 *)((long)puVar7 + 4);
    pfVar2 = pfVar2 + 1;
  } while (lVar1 != 4);
  uVar3 = (ulong)((this->super_TextureQueryInstance).m_textureSpec)->type;
  uVar8 = 0;
  if (uVar3 < 7) {
    uVar8 = *(uint *)(&DAT_00b24168 + uVar3 * 4);
  }
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 1.0;
  local_108[0] = 0.0;
  local_108[1] = 0.0;
  local_108[2] = 0.0;
  local_108[3] = 0.0;
  puVar7 = &local_a8;
  lVar1 = 0;
  do {
    fVar10 = 0.0;
    lVar9 = 0;
    do {
      fVar10 = fVar10 + *(float *)((long)puVar7 + lVar9 * 4) * *(float *)((long)local_68 + lVar9);
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0x10);
    local_108[lVar1] = fVar10;
    lVar1 = lVar1 + 1;
    puVar7 = (undefined8 *)((long)puVar7 + 4);
  } while (lVar1 != 4);
  local_138 = 0x3f80000000000000;
  uStack_130 = 0x3f80000000000000;
  local_f8 = 0;
  lStack_f0 = 0;
  puVar7 = &local_a8;
  lVar1 = 0;
  do {
    fVar10 = 0.0;
    lVar9 = 0;
    do {
      fVar10 = fVar10 + *(float *)((long)puVar7 + lVar9 * 4) * *(float *)((long)&local_138 + lVar9);
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0x10);
    *(float *)((long)&local_f8 + lVar1 * 4) = fVar10;
    lVar1 = lVar1 + 1;
    puVar7 = (undefined8 *)((long)puVar7 + 4);
  } while (lVar1 != 4);
  local_c8[4] = 1.0;
  local_c8[5] = 0.0;
  local_c8[6] = 0.0;
  local_c8[7] = 1.0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  lStack_e0 = 0;
  puVar7 = &local_a8;
  lVar1 = 0;
  do {
    fVar10 = 0.0;
    lVar9 = 0;
    do {
      fVar10 = fVar10 + *(float *)((long)puVar7 + lVar9 * 4) *
                        *(float *)((long)local_c8 + lVar9 + 0x10);
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0x10);
    local_e8[lVar1] = fVar10;
    lVar1 = lVar1 + 1;
    puVar7 = (undefined8 *)((long)puVar7 + 4);
  } while (lVar1 != 4);
  local_c8[0] = 1.0;
  local_c8[1] = 1.0;
  local_c8[2] = 0.0;
  local_c8[3] = 1.0;
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  lStack_d0 = 0;
  puVar7 = &local_a8;
  lVar1 = 0;
  do {
    fVar10 = 0.0;
    lVar9 = 0;
    do {
      fVar10 = fVar10 + *(float *)((long)puVar7 + lVar9 * 4) * *(float *)((long)local_c8 + lVar9);
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0x10);
    local_d8[lVar1] = fVar10;
    lVar1 = lVar1 + 1;
    puVar7 = (undefined8 *)((long)puVar7 + 4);
  } while (lVar1 != 4);
  uStack_140 = 0x6309fa;
  std::vector<float,_std::allocator<float>_>::resize(&local_128,(ulong)(uVar8 * 4));
  lVar1 = 0;
  lVar9 = 0;
  do {
    uStack_140 = 0x630a1f;
    memcpy((void *)((long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar1),
           (void *)((long)local_108 + lVar9),(ulong)(uVar8 * 4));
    lVar9 = lVar9 + 0x10;
    lVar1 = lVar1 + (ulong)uVar8 * 4;
  } while (lVar9 != 0x40);
  uVar3 = (ulong)((this->super_TextureQueryInstance).m_textureSpec)->type;
  iVar4 = 0;
  if (uVar3 < 7) {
    iVar4 = *(int *)(&DAT_00b24168 + uVar3 * 4);
  }
  uStack_140 = 0x630a70;
  ShaderRenderCaseInstance::addAttribute
            ((ShaderRenderCaseInstance *)this,1,
             *(VkFormat *)
              ("N3vkt2sr12_GLOBAL__N_123TextureQueryLodInstanceE" + (long)iVar4 * 4 + 0x30),
             iVar4 << 2,4,
             local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    uStack_140 = 0x630a87;
    operator_delete(local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TextureQueryLodInstance::setupDefaultInputs (void)
{
	TextureQueryInstance::setupDefaultInputs();

	const deUint32			numVertices			= 4;
	const vector<float>		texCoord			= computeQuadTexCoord();
	const int				texCoordComps		= getQueryLodFuncTextCoordComps(m_textureSpec.type);
	const vk::VkFormat		coordFormats[]		=
	{
		vk::VK_FORMAT_R32_SFLOAT,
		vk::VK_FORMAT_R32G32_SFLOAT,
		vk::VK_FORMAT_R32G32B32_SFLOAT
	};

	DE_ASSERT(de::inRange(texCoordComps, 1, 3));
	DE_ASSERT((int)texCoord.size() == texCoordComps * 4);

	addAttribute(1u, coordFormats[texCoordComps - 1], (deUint32)(texCoordComps * sizeof(float)), numVertices, texCoord.data());
}